

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O1

ON_3dPoint * __thiscall
ON_SubDFace::ControlNetCenterPoint(ON_3dPoint *__return_storage_ptr__,ON_SubDFace *this)

{
  double dVar1;
  ON_SubDVertex *this_00;
  ushort uVar2;
  ON_SubDEdgePtr *this_01;
  ON_3dPoint center;
  ON_3dPoint local_78;
  ON_3dPoint local_60;
  ON_3dVector local_48;
  
  if (this->m_edge_count < 3) {
    __return_storage_ptr__->z = ON_3dPoint::NanPoint.z;
    dVar1 = ON_3dPoint::NanPoint.y;
    __return_storage_ptr__->x = ON_3dPoint::NanPoint.x;
    __return_storage_ptr__->y = dVar1;
    return __return_storage_ptr__;
  }
  ON_3dPoint::ON_3dPoint(&local_78,0.0,0.0,0.0);
  if (this->m_edge_count != 0) {
    this_01 = this->m_edge4;
    uVar2 = 0;
    do {
      if ((uVar2 == 4) && (this_01 = this->m_edgex, this_01 == (ON_SubDEdgePtr *)0x0)) {
        __return_storage_ptr__->z = ON_3dPoint::NanPoint.z;
        dVar1 = ON_3dPoint::NanPoint.y;
        __return_storage_ptr__->x = ON_3dPoint::NanPoint.x;
        __return_storage_ptr__->y = dVar1;
        return __return_storage_ptr__;
      }
      this_00 = ON_SubDEdgePtr::RelativeVertex(this_01,0);
      if (this_00 == (ON_SubDVertex *)0x0) {
        __return_storage_ptr__->z = ON_3dPoint::NanPoint.z;
        dVar1 = ON_3dPoint::NanPoint.y;
        __return_storage_ptr__->x = ON_3dPoint::NanPoint.x;
        __return_storage_ptr__->y = dVar1;
        return __return_storage_ptr__;
      }
      ON_SubDVertex::ControlNetPoint(&local_60,this_00);
      ON_3dVector::ON_3dVector(&local_48,&local_60);
      ON_3dPoint::operator+=(&local_78,&local_48);
      uVar2 = uVar2 + 1;
      this_01 = this_01 + 1;
    } while (uVar2 < this->m_edge_count);
  }
  dVar1 = (double)this->m_edge_count;
  __return_storage_ptr__->z = local_78.z / dVar1;
  __return_storage_ptr__->x = local_78.x / dVar1;
  __return_storage_ptr__->y = local_78.y / dVar1;
  return __return_storage_ptr__;
}

Assistant:

const ON_3dPoint ON_SubDFace::ControlNetCenterPoint() const
{
  if (m_edge_count < 3)
    return ON_3dPoint::NanPoint;
  ON_3dPoint center(0.0, 0.0, 0.0);
  const ON_SubDEdgePtr* eptr = m_edge4;
  for (unsigned short fvi = 0; fvi < m_edge_count; ++fvi, ++eptr)
  {
    if (4 == fvi)
    {
      eptr = m_edgex;
      if ( nullptr == eptr)
        return ON_3dPoint::NanPoint;
    }
    const ON_SubDVertex* v = eptr->RelativeVertex(0);
    if ( nullptr == v)
      return ON_3dPoint::NanPoint;
    center += v->ControlNetPoint();
  }
  const double c = (double)m_edge_count;
  center.x /= c;
  center.y /= c;
  center.z /= c;
  return center;
}